

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
* __thiscall
phmap::priv::
btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
::operator--(btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
             *this)

{
  btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
  bVar1;
  int iVar2;
  uint uVar3;
  btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
  *pbVar4;
  undefined8 uVar5;
  bool bVar6;
  btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
  *pbVar7;
  btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
  *pbVar8;
  char *__function;
  size_type i;
  int iStack_10;
  
  pbVar8 = this->node;
  if (((ulong)pbVar8 & 7) != 0) {
LAB_00137f8b:
    __function = 
    "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const int, int>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const int, int>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const int, int>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const int, int>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
    ;
LAB_00137fd6:
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                  ,0xf84,__function);
  }
  if ((pbVar8[0xb] ==
       (btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
        )0x0) || (iVar2 = this->position, this->position = iVar2 + -1, iVar2 < 1)) {
    uVar3 = this->position;
    i = (size_type)uVar3;
    if (pbVar8[0xb] ==
        (btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
         )0x0) {
      if ((int)uVar3 < 0) {
        __assert_fail("position >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x994,
                      "void phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int, int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const int, int>>, 256, false>>, std::pair<const int, int> &, std::pair<const int, int> *>::decrement_slow() [Node = phmap::priv::btree_node<phmap::priv::map_params<int, int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const int, int>>, 256, false>>, Reference = std::pair<const int, int> &, Pointer = std::pair<const int, int> *]"
                     );
      }
      do {
        pbVar8 = btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
                 ::child(pbVar8,i);
        this->node = pbVar8;
        if (((ulong)pbVar8 & 7) != 0) goto LAB_00137f8b;
        i = (size_type)(byte)pbVar8[10];
      } while (pbVar8[0xb] ==
               (btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
                )0x0);
      this->position = (byte)pbVar8[10] - 1;
    }
    else {
      if (-1 < (int)uVar3) {
        __assert_fail("position <= -1",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x989,
                      "void phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int, int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const int, int>>, 256, false>>, std::pair<const int, int> &, std::pair<const int, int> *>::decrement_slow() [Node = phmap::priv::btree_node<phmap::priv::map_params<int, int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const int, int>>, 256, false>>, Reference = std::pair<const int, int> &, Pointer = std::pair<const int, int> *]"
                     );
      }
      pbVar8 = this->node;
      uVar5 = *(undefined8 *)&this->position;
      do {
        bVar6 = btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
                ::is_root(this->node);
        if (bVar6) break;
        pbVar4 = this->node;
        if (((ulong)pbVar4 & 7) != 0) {
          __function = 
          "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const int, int>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const int, int>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const int, int>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const int, int>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = const char]"
          ;
          goto LAB_00137fd6;
        }
        pbVar7 = btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
                 ::child(*(btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
                           **)pbVar4,(ulong)(byte)pbVar4[8]);
        pbVar4 = this->node;
        if (pbVar7 != pbVar4) {
          __assert_fail("node->parent()->child(node->position()) == node",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                        ,0x98c,
                        "void phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int, int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const int, int>>, 256, false>>, std::pair<const int, int> &, std::pair<const int, int> *>::decrement_slow() [Node = phmap::priv::btree_node<phmap::priv::map_params<int, int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const int, int>>, 256, false>>, Reference = std::pair<const int, int> &, Pointer = std::pair<const int, int> *]"
                       );
        }
        if (((ulong)pbVar4 & 7) != 0) goto LAB_00137f8b;
        bVar1 = pbVar4[8];
        this->position = (byte)bVar1 - 1;
        this->node = *(btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
                       **)pbVar4;
      } while (bVar1 == (btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
                         )0x0);
      if (this->position < 0) {
        iStack_10 = (int)uVar5;
        this->position = iStack_10;
        this->node = pbVar8;
      }
    }
  }
  return this;
}

Assistant:

btree_iterator& operator--() {
            decrement();
            return *this;
        }